

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O3

void __thiscall wasm::StackSignature::StackSignature(StackSignature *this,Expression *expr)

{
  uintptr_t uVar1;
  void *pvVar2;
  pointer pTVar3;
  Index IVar4;
  size_t sVar5;
  Expression ***pppEVar6;
  uintptr_t uVar7;
  Index IVar8;
  Type *this_00;
  Index index;
  Type local_a0;
  StackSignature *local_98;
  Expression *local_90;
  AbstractChildIterator<wasm::ValueChildIterator> local_88;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> inputs;
  
  (this->params).id = 0;
  (this->results).id = 0;
  auStack_48 = (undefined1  [8])0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator(&local_88,expr);
  IVar8 = (int)((ulong)((long)local_88.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_88.children.usedFixed;
  if (IVar8 != 0) {
    index = 0;
    local_98 = this;
    local_90 = expr;
    do {
      IVar4 = AbstractChildIterator<wasm::ValueChildIterator>::mapIndex(&local_88,index);
      pTVar3 = inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pppEVar6 = local_88.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar4 - 4);
      if (IVar4 < 4) {
        pppEVar6 = local_88.children.fixed._M_elems + IVar4;
      }
      if (((**pppEVar6)->type).id < 2) {
        __assert_fail("child->type.isConcrete()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/stack-utils.cpp"
                      ,0x3e,"wasm::StackSignature::StackSignature(Expression *)");
      }
      this_00 = &(**pppEVar6)->type;
      sVar5 = wasm::Type::size(this_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_range_insert<wasm::Type::Iterator>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,pTVar3,this_00,0,
                 this_00,sVar5);
      index = index + 1;
      this = local_98;
      expr = local_90;
    } while (IVar8 != index);
  }
  if (local_88.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Tuple::Tuple((Tuple *)&local_88,(TypeList *)auStack_48);
  wasm::Type::Type(&local_a0,(Tuple *)&local_88);
  (this->params).id = local_a0.id;
  pvVar2 = (void *)CONCAT44(local_88.children.usedFixed._4_4_,(int)local_88.children.usedFixed);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_88.children.fixed._M_elems[1] - (long)pvVar2);
  }
  uVar1 = (expr->type).id;
  uVar7 = 0;
  if (uVar1 != 1) {
    uVar7 = uVar1;
  }
  this->kind = (uint)(uVar1 == 1);
  (this->results).id = uVar7;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

StackSignature::StackSignature(Expression* expr) {
  std::vector<Type> inputs;
  for (auto* child : ValueChildIterator(expr)) {
    assert(child->type.isConcrete());
    // Children might be tuple pops, so expand their types
    inputs.insert(inputs.end(), child->type.begin(), child->type.end());
  }
  params = Type(inputs);
  if (expr->type == Type::unreachable) {
    kind = Polymorphic;
    results = Type::none;
  } else {
    kind = Fixed;
    results = expr->type;
  }
}